

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

double __thiscall chaiscript::Boxed_Number::remainder(Boxed_Number *this,double __x,double __y)

{
  Boxed_Value *in_RDX;
  Boxed_Value *in_RSI;
  double extraout_XMM0_Qa;
  Boxed_Number local_20;
  
  oper(&local_20,remainder,in_RSI,in_RDX);
  Boxed_Number(this,&local_20.bv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.bv.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return extraout_XMM0_Qa;
}

Assistant:

static const Boxed_Number remainder(const Boxed_Number &t_lhs, const Boxed_Number &t_rhs) {
      return Boxed_Number(oper(Operators::Opers::remainder, t_lhs.bv, t_rhs.bv));
    }